

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

c_float vec_mean(c_float *a,c_int n)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  lVar1 = 0;
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  dVar3 = 0.0;
  for (; lVar2 != lVar1; lVar1 = lVar1 + 1) {
    dVar3 = dVar3 + a[lVar1];
  }
  return dVar3 / (double)n;
}

Assistant:

c_float vec_mean(const c_float *a, c_int n) {
  c_float mean = 0.0;
  c_int   i;

  for (i = 0; i < n; i++) {
    mean += a[i];
  }
  mean /= (c_float)n;

  return mean;
}